

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O0

void __thiscall TasgridWrapper::outputPoints(TasgridWrapper *this,output_points_mode mode)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  int local_4c;
  undefined1 local_30 [8];
  vector<double,_std::allocator<double>_> points;
  int num_points;
  output_points_mode mode_local;
  TasgridWrapper *this_local;
  
  points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = mode;
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) || ((this->printCout & 1U) != 0)) {
    if (points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ == needed) {
      local_4c = TasGrid::TasmanianSparseGrid::getNumNeeded(&this->grid);
    }
    else {
      local_4c = TasGrid::TasmanianSparseGrid::getNumPoints(&this->grid);
    }
    points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = local_4c;
    if (points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ == needed) {
      TasGrid::TasmanianSparseGrid::getNeededPoints
                ((vector<double,_std::allocator<double>_> *)local_30,&this->grid);
    }
    else {
      TasGrid::TasmanianSparseGrid::getPoints
                ((vector<double,_std::allocator<double>_> *)local_30,&this->grid);
    }
    iVar2 = (int)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    iVar1 = this->num_dimensions;
    pdVar4 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)local_30);
    writeMatrix(this,&this->outfilename,iVar2,iVar1,pdVar4);
    iVar2 = (int)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    iVar1 = this->num_dimensions;
    pdVar4 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)local_30);
    printMatrix(this,iVar2,iVar1,pdVar4,false);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_30);
  }
  return;
}

Assistant:

void TasgridWrapper::outputPoints(output_points_mode mode) const{
    if (outfilename.empty() and not printCout) return;
    int num_points = (mode == output_points_mode::needed) ? grid.getNumNeeded() : grid.getNumPoints();
    auto points = (mode == output_points_mode::needed) ? grid.getNeededPoints() : grid.getPoints();
    writeMatrix(outfilename, num_points, num_dimensions, points.data());
    printMatrix(num_points, num_dimensions, points.data());
}